

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineRenderToImageTests.cpp
# Opt level: O0

void vkt::pipeline::anon_unknown_0::initPrograms
               (SourceCollections *programCollection,CaseDef_conflict *caseDef)

{
  bool bVar1;
  bool bVar2;
  bool isUint_00;
  uint uVar3;
  TextureFormat TVar4;
  char *pcVar5;
  ostream *poVar6;
  ProgramSources *pPVar7;
  undefined1 in_R8B;
  char *local_780;
  char *local_778;
  string local_650;
  ShaderSource local_630;
  allocator<char> local_601;
  string local_600;
  ostringstream local_5e0 [8];
  ostringstream src_1;
  allocator<char> local_463;
  byte local_462;
  byte local_461;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  byte local_43a;
  byte local_439;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  undefined1 local_3d8 [8];
  string colorInteger;
  string colorFormat;
  ostringstream colorValue;
  string local_220;
  ShaderSource local_200;
  allocator<char> local_1d1;
  string local_1d0;
  ostringstream local_1a0 [8];
  ostringstream src;
  ChannelOrder CStack_24;
  bool isSint;
  bool isUint;
  int numComponents;
  CaseDef_conflict *caseDef_local;
  SourceCollections *programCollection_local;
  
  TVar4 = ::vk::mapVkFormat(caseDef->colorFormat);
  CStack_24 = TVar4.order;
  uVar3 = tcu::getNumUsedChannels(CStack_24);
  bVar2 = ::vk::isUintFormat(caseDef->colorFormat);
  isUint_00 = ::vk::isIntFormat(caseDef->colorFormat);
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  pcVar5 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  poVar6 = std::operator<<((ostream *)local_1a0,pcVar5);
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,"layout(location = 0) in  vec4 in_position;\n");
  poVar6 = std::operator<<(poVar6,"layout(location = 1) in  vec4 in_color;\n");
  poVar6 = std::operator<<(poVar6,"layout(location = 0) out vec4 out_color;\n");
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,"out gl_PerVertex {\n");
  poVar6 = std::operator<<(poVar6,"\tvec4 gl_Position;\n");
  poVar6 = std::operator<<(poVar6,"};\n");
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,"void main(void)\n");
  poVar6 = std::operator<<(poVar6,"{\n");
  poVar6 = std::operator<<(poVar6,"\tgl_Position\t= in_position;\n");
  poVar6 = std::operator<<(poVar6,"\tout_color\t= in_color;\n");
  std::operator<<(poVar6,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"vert",&local_1d1);
  pPVar7 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_1d0);
  std::__cxx11::ostringstream::str();
  glu::VertexSource::VertexSource((VertexSource *)&local_200,&local_220);
  glu::ProgramSources::operator<<(pPVar7,&local_200);
  glu::VertexSource::~VertexSource((VertexSource *)&local_200);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::__cxx11::ostringstream::ostringstream
            ((ostringstream *)(colorFormat.field_2._M_local_buf + 8));
  std::ostream::operator<<((ostringstream *)(colorFormat.field_2._M_local_buf + 8),0x7d);
  pipeline::(anonymous_namespace)::getColorFormatStr_abi_cxx11_
            ((string *)((long)&colorInteger.field_2 + 8),(_anonymous_namespace_ *)(ulong)uVar3,
             (uint)bVar2,isUint_00,(bool)in_R8B);
  local_439 = 0;
  local_43a = 0;
  local_461 = 0;
  local_462 = 0;
  bVar1 = false;
  if ((bVar2) || (isUint_00)) {
    std::operator+(&local_438," * ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&colorInteger.field_2 + 8));
    local_439 = 1;
    std::operator+(&local_418,&local_438,"(");
    local_43a = 1;
    std::__cxx11::ostringstream::str();
    local_461 = 1;
    std::operator+(&local_3f8,&local_418,&local_460);
    local_462 = 1;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d8,
                   &local_3f8,")");
  }
  else {
    std::allocator<char>::allocator();
    bVar1 = true;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_3d8,"",&local_463);
  }
  if (bVar1) {
    std::allocator<char>::~allocator(&local_463);
  }
  if ((local_462 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_3f8);
  }
  if ((local_461 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_460);
  }
  if ((local_43a & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_418);
  }
  if ((local_439 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_438);
  }
  std::__cxx11::ostringstream::ostringstream(local_5e0);
  pcVar5 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  poVar6 = std::operator<<((ostream *)local_5e0,pcVar5);
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,"layout(location = 0) in  vec4 in_color;\n");
  poVar6 = std::operator<<(poVar6,"layout(location = 0) out ");
  poVar6 = std::operator<<(poVar6,(string *)(colorInteger.field_2._M_local_buf + 8));
  poVar6 = std::operator<<(poVar6," o_color;\n");
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,"void main(void)\n");
  poVar6 = std::operator<<(poVar6,"{\n");
  poVar6 = std::operator<<(poVar6,"    o_color = ");
  poVar6 = std::operator<<(poVar6,(string *)(colorInteger.field_2._M_local_buf + 8));
  poVar6 = std::operator<<(poVar6,"(");
  if (uVar3 == 1) {
    local_778 = "in_color.r";
  }
  else {
    if (uVar3 == 2) {
      local_780 = "in_color.rg";
    }
    else {
      local_780 = "in_color";
      if (uVar3 == 3) {
        local_780 = "in_color.rgb";
      }
    }
    local_778 = local_780;
  }
  poVar6 = std::operator<<(poVar6,local_778);
  poVar6 = std::operator<<(poVar6,(string *)local_3d8);
  poVar6 = std::operator<<(poVar6,");\n");
  std::operator<<(poVar6,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_600,"frag",&local_601);
  pPVar7 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_600);
  std::__cxx11::ostringstream::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_630,&local_650);
  glu::ProgramSources::operator<<(pPVar7,&local_630);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_630);
  std::__cxx11::string::~string((string *)&local_650);
  std::__cxx11::string::~string((string *)&local_600);
  std::allocator<char>::~allocator(&local_601);
  std::__cxx11::ostringstream::~ostringstream(local_5e0);
  std::__cxx11::string::~string((string *)local_3d8);
  std::__cxx11::string::~string((string *)(colorInteger.field_2._M_local_buf + 8));
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)(colorFormat.field_2._M_local_buf + 8));
  return;
}

Assistant:

void initPrograms (SourceCollections& programCollection, const CaseDef caseDef)
{
	const int	numComponents	= getNumUsedChannels(mapVkFormat(caseDef.colorFormat).order);
	const bool	isUint			= isUintFormat(caseDef.colorFormat);
	const bool	isSint			= isIntFormat(caseDef.colorFormat);

	// Vertex shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(location = 0) in  vec4 in_position;\n"
			<< "layout(location = 1) in  vec4 in_color;\n"
			<< "layout(location = 0) out vec4 out_color;\n"
			<< "\n"
			<< "out gl_PerVertex {\n"
			<< "	vec4 gl_Position;\n"
			<< "};\n"
			<< "\n"
			<< "void main(void)\n"
			<< "{\n"
			<< "	gl_Position	= in_position;\n"
			<< "	out_color	= in_color;\n"
			<< "}\n";

		programCollection.glslSources.add("vert") << glu::VertexSource(src.str());
	}

	// Fragment shader
	{
		std::ostringstream colorValue;
		colorValue << REFERENCE_COLOR_VALUE;
		const std::string colorFormat	= getColorFormatStr(numComponents, isUint, isSint);
		const std::string colorInteger	= (isUint || isSint ? " * "+colorFormat+"("+colorValue.str()+")" :"");

		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(location = 0) in  vec4 in_color;\n"
			<< "layout(location = 0) out " << colorFormat << " o_color;\n"
			<< "\n"
			<< "void main(void)\n"
			<< "{\n"
			<< "    o_color = " << colorFormat << "("
			<< (numComponents == 1 ? "in_color.r"   :
				numComponents == 2 ? "in_color.rg"  :
				numComponents == 3 ? "in_color.rgb" : "in_color")
			<< colorInteger
			<< ");\n"
			<< "}\n";

		programCollection.glslSources.add("frag") << glu::FragmentSource(src.str());
	}
}